

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_bson.hpp
# Opt level: O3

type __thiscall
jsoncons::bson::decode_bson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
          (bson *this,istream *is,bson_decode_options *options)

{
  system_error *this_00;
  allocator<char> *temp_alloc;
  void *__buf;
  undefined8 extraout_RDX;
  type tVar1;
  error_code __ec;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  decoder;
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>,_void>
  adaptor;
  bson_stream_reader reader;
  allocator<char> local_301;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  local_300;
  error_code local_280;
  undefined **local_270;
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  *local_268;
  basic_bson_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> local_260;
  
  json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
  ::json_decoder(&local_300,(allocator_type *)&local_260,(temp_allocator_type *)&local_270);
  local_270 = &PTR__basic_json_visitor_00b30c58;
  temp_alloc = &local_301;
  local_268 = &local_300;
  basic_bson_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
  basic_bson_parser<std::istream&>
            ((basic_bson_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *)
             &local_260,is,options,temp_alloc);
  local_260.visitor_ = (json_visitor *)&local_270;
  basic_bson_reader<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::read
            (&local_260,(int)is,__buf,(size_t)temp_alloc);
  if (local_300.is_valid_ != false) {
    json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
    ::get_result((json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>
                  *)this);
    local_260.parser_.super_ser_context._vptr_ser_context =
         (_func_int **)&PTR__basic_bson_parser_00b30b78;
    if (local_260.parser_.state_stack_.
        super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_260.parser_.state_stack_.
                      super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_260.parser_.state_stack_.
                            super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_260.parser_.state_stack_.
                            super__Vector_base<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.parser_.text_buffer_._M_dataplus._M_p !=
        &local_260.parser_.text_buffer_.field_2) {
      operator_delete(local_260.parser_.text_buffer_._M_dataplus._M_p,
                      local_260.parser_.text_buffer_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.parser_.name_buffer_._M_dataplus._M_p !=
        &local_260.parser_.name_buffer_.field_2) {
      operator_delete(local_260.parser_.name_buffer_._M_dataplus._M_p,
                      local_260.parser_.name_buffer_.field_2._M_allocated_capacity + 1);
    }
    if (local_260.parser_.bytes_buffer_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_260.parser_.bytes_buffer_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_260.parser_.bytes_buffer_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_260.parser_.bytes_buffer_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    stream_source<unsigned_char>::~stream_source(&local_260.parser_.source_);
    if (local_300.structure_stack_.
        super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_300.structure_stack_.
                      super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_300.structure_stack_.
                            super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_300.structure_stack_.
                            super__Vector_base<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info,_std::allocator<jsoncons::json_decoder<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<char>_>::structure_info>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::index_key_value<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
    ::~vector(&local_300.item_stack_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300.name_._M_dataplus._M_p != &local_300.name_.field_2) {
      operator_delete(local_300.name_._M_dataplus._M_p,
                      local_300.name_.field_2._M_allocated_capacity + 1);
    }
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::destroy(&local_300.result_);
    tVar1.field_0.int64_.val_ = extraout_RDX;
    tVar1.field_0._0_8_ = this;
    return (type)tVar1.field_0;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x58);
  std::error_code::error_code<jsoncons::conv_errc,void>(&local_280,conversion_failed);
  __ec._4_4_ = 0;
  __ec._M_value = local_280._M_value;
  *(undefined ***)(this_00 + 0x50) = &PTR__json_exception_00b2f248;
  __ec._M_cat = local_280._M_cat;
  std::system_error::system_error(this_00,__ec);
  *(undefined8 *)this_00 = 0xb2f1e8;
  *(undefined8 *)(this_00 + 0x50) = 0xb2f220;
  *(undefined8 *)(this_00 + 0x20) = 0;
  *(size_t *)(this_00 + 0x28) = local_260.parser_.source_.position_;
  *(system_error **)(this_00 + 0x30) = this_00 + 0x40;
  *(undefined8 *)(this_00 + 0x38) = 0;
  this_00[0x40] = (system_error)0x0;
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value,T>::type 
    decode_bson(std::istream& is, 
                const bson_decode_options& options = bson_decode_options())
    {
        jsoncons::json_decoder<T> decoder;
        auto adaptor = make_json_visitor_adaptor<json_visitor>(decoder);
        bson_stream_reader reader(is, adaptor, options);
        reader.read();
        if (!decoder.is_valid())
        {
            JSONCONS_THROW(ser_error(conv_errc::conversion_failed, reader.line(), reader.column()));
        }
        return decoder.get_result();
    }